

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture2_LoadImageDataTest_InvalidOpWhenDataAlreadyLoadedToExternal_Test
::~ktxTexture2_LoadImageDataTest_InvalidOpWhenDataAlreadyLoadedToExternal_Test
          (ktxTexture2_LoadImageDataTest_InvalidOpWhenDataAlreadyLoadedToExternal_Test *this)

{
  void *in_RDI;
  
  ~ktxTexture2_LoadImageDataTest_InvalidOpWhenDataAlreadyLoadedToExternal_Test
            ((ktxTexture2_LoadImageDataTest_InvalidOpWhenDataAlreadyLoadedToExternal_Test *)0x13c478
            );
  operator_delete(in_RDI,0x1e0);
  return;
}

Assistant:

TEST_F(ktxTexture2_LoadImageDataTest, InvalidOpWhenDataAlreadyLoadedToExternal) {
    ktxTexture* texture = 0;
    KTX_error_code result;
    ktx_uint8_t* buf;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0,
                                             &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData == NULL) << "Image data must not be loaded";
        buf = new ktx_uint8_t[paddedImageDataSize];
        EXPECT_EQ(ktxTexture_LoadImageData(texture, buf, paddedImageDataSize),
                  KTX_SUCCESS);
        EXPECT_EQ(ktxTexture_LoadImageData(texture, buf, paddedImageDataSize),
                  KTX_INVALID_OPERATION);
        if (texture)
            ktxTexture_Destroy(texture);
        delete[] buf;
    }
}